

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Statement> __thiscall Parser::inputStatement(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Statement> pVar1;
  shared_ptr<Expression> local_48 [2];
  undefined1 local_28 [8];
  ptr<Expression> expr;
  Parser *this_local;
  
  consume(in_RSI);
  expression((Parser *)local_28);
  consume(in_RSI,StatEnd,"\';\'");
  make<InputStatement,std::shared_ptr<Expression>&>(local_48);
  std::shared_ptr<Statement>::shared_ptr<InputStatement,void>
            ((shared_ptr<Statement> *)this,(shared_ptr<InputStatement> *)local_48);
  std::shared_ptr<InputStatement>::~shared_ptr((shared_ptr<InputStatement> *)local_48);
  std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_28);
  pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::inputStatement() {
    consume();
    ptr<Expression> expr = expression();
    consume(TokenType::StatEnd, "';'");
    return make<InputStatement>(expr);
}